

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuThreadUtil.cpp
# Opt level: O2

void __thiscall
tcu::ThreadUtil::Object::modify
          (Object *this,SharedPtr<tcu::ThreadUtil::Event> *event,
          vector<de::SharedPtr<tcu::ThreadUtil::Event>,_std::allocator<de::SharedPtr<tcu::ThreadUtil::Event>_>_>
          *deps)

{
  pointer pSVar1;
  int readNdx;
  long lVar2;
  long lVar3;
  
  lVar3 = 0;
  for (lVar2 = 0;
      pSVar1 = (this->m_reads).
               super__Vector_base<de::SharedPtr<tcu::ThreadUtil::Event>,_std::allocator<de::SharedPtr<tcu::ThreadUtil::Event>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
      lVar2 < (int)((ulong)((long)(this->m_reads).
                                  super__Vector_base<de::SharedPtr<tcu::ThreadUtil::Event>,_std::allocator<de::SharedPtr<tcu::ThreadUtil::Event>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar1) >> 4);
      lVar2 = lVar2 + 1) {
    std::
    vector<de::SharedPtr<tcu::ThreadUtil::Event>,_std::allocator<de::SharedPtr<tcu::ThreadUtil::Event>_>_>
    ::push_back(deps,(value_type *)((long)&pSVar1->m_ptr + lVar3));
    lVar3 = lVar3 + 0x10;
  }
  std::
  vector<de::SharedPtr<tcu::ThreadUtil::Event>,_std::allocator<de::SharedPtr<tcu::ThreadUtil::Event>_>_>
  ::push_back(deps,&this->m_modify);
  de::SharedPtr<tcu::ThreadUtil::Event>::operator=(&this->m_modify,event);
  std::
  vector<de::SharedPtr<tcu::ThreadUtil::Event>,_std::allocator<de::SharedPtr<tcu::ThreadUtil::Event>_>_>
  ::clear(&this->m_reads);
  return;
}

Assistant:

void Object::modify (SharedPtr<Event> event, std::vector<SharedPtr<Event> >& deps)
{
	// Make call depend on all reads
	for (int readNdx = 0; readNdx < (int)m_reads.size(); readNdx++)
	{
		deps.push_back(m_reads[readNdx]);
	}
	deps.push_back(m_modify);

	// Update last modifying call
	m_modify = event;

	// Clear read dependencies of last "version" of this object
	m_reads.clear();
}